

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_manager.c
# Opt level: O2

time_t mm_time(int test_mode,time_t *rawtime)

{
  time_t tVar1;
  
  if (test_mode == 0) {
    time(rawtime);
    tVar1 = *rawtime;
  }
  else {
    *rawtime = 0x5e0c5180;
    tVar1 = 0x5e0c5180;
  }
  return tVar1;
}

Assistant:

time_t mm_time(int test_mode, time_t *rawtime) {
    if (test_mode) {
        /* When in test mode, use a static time, so that results are consistent. */
        *rawtime = JAN12020;
    }
    else {
        time(rawtime);
    }

    return *rawtime;
}